

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

void __thiscall HEkk::computePrimalObjectiveValue(HEkk *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pcVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double dVar10;
  
  HighsSimplexAnalysis::simplexTimerStart(&this->analysis_,0x24,0);
  (this->info_).primal_objective_value = 0.0;
  lVar7 = (long)(this->lp_).num_row_;
  uVar1 = (this->lp_).num_col_;
  if (lVar7 < 1) {
    dVar10 = 0.0;
  }
  else {
    piVar3 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).baseValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dVar10 = 0.0;
    lVar9 = 0;
    do {
      iVar2 = piVar3[lVar9];
      if (iVar2 < (int)uVar1) {
        dVar10 = dVar10 + pdVar4[lVar9] * pdVar5[iVar2];
        (this->info_).primal_objective_value = dVar10;
      }
      lVar9 = lVar9 + 1;
    } while (lVar7 != lVar9);
  }
  if (0 < (int)uVar1) {
    pcVar6 = (this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->lp_).col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar8 = 0;
    do {
      if (pcVar6[uVar8] != '\0') {
        dVar10 = dVar10 + pdVar4[uVar8] * pdVar5[uVar8];
        (this->info_).primal_objective_value = dVar10;
      }
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  (this->info_).primal_objective_value = dVar10 * this->cost_scale_ + (this->lp_).offset_;
  (this->status_).has_primal_objective_value = true;
  HighsSimplexAnalysis::simplexTimerStop(&this->analysis_,0x24,0);
  return;
}

Assistant:

void HEkk::computePrimalObjectiveValue() {
  analysis_.simplexTimerStart(ComputePrObjClock);
  info_.primal_objective_value = 0;
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = basis_.basicIndex_[iRow];
    if (iVar < lp_.num_col_) {
      info_.primal_objective_value +=
          info_.baseValue_[iRow] * lp_.col_cost_[iVar];
    }
  }
  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    if (basis_.nonbasicFlag_[iCol])
      info_.primal_objective_value +=
          info_.workValue_[iCol] * lp_.col_cost_[iCol];
  }
  info_.primal_objective_value *= cost_scale_;
  // Objective value calculation is done using primal values and
  // original costs so offset is vanilla
  info_.primal_objective_value += lp_.offset_;
  // Now have primal objective value
  status_.has_primal_objective_value = true;
  analysis_.simplexTimerStop(ComputePrObjClock);
}